

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintExpressionContents::visitTry(PrintExpressionContents *this,Try *curr)

{
  undefined1 auVar1 [16];
  string_view str;
  
  str._M_str = "try";
  str._M_len = 3;
  printMedium(this->o,str);
  if ((curr->name).super_IString.str._M_str != (char *)0x0) {
    std::operator<<(this->o,' ');
    Name::print(&curr->name,this->o);
  }
  if (1 < (curr->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id) {
    std::operator<<(this->o,' ');
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (curr->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.
                   id;
    printBlockType(this,(Signature)(auVar1 << 0x40));
    return;
  }
  return;
}

Assistant:

void visitTry(Try* curr) {
    printMedium(o, "try");
    if (curr->name.is()) {
      o << ' ';
      curr->name.print(o);
    }
    if (curr->type.isConcrete()) {
      o << ' ';
      printBlockType(Signature(Type::none, curr->type));
    }
  }